

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

void LEARNER::multiline_learn_or_predict<true>
               (multi_learner *base,multi_ex *examples,uint64_t offset,uint32_t id)

{
  pointer ppeVar1;
  ulong uVar2;
  multi_ex *__range2;
  uint64_t *__x;
  pointer ppeVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> saved_offsets;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppeVar1 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppeVar3 != ppeVar1; ppeVar3 = ppeVar3 + 1) {
    __x = &((*ppeVar3)->super_example_predict).ft_offset;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,__x);
    *__x = offset;
  }
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn(base,examples,(ulong)id)
  ;
  for (uVar2 = 0;
      ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3);
      uVar2 = uVar2 + 1) {
    (ppeVar3[uVar2]->super_example_predict).ft_offset =
         local_48._M_impl.super__Vector_impl_data._M_start[uVar2];
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void multiline_learn_or_predict(multi_learner& base, multi_ex& examples, const uint64_t offset, const uint32_t id = 0)
{
  std::vector<uint64_t> saved_offsets;
  for (auto ec : examples)
  {
    saved_offsets.push_back(ec->ft_offset);
    ec->ft_offset = offset;
  }

  if (is_learn)
    base.learn(examples, id);
  else
    base.predict(examples, id);

  for (size_t i = 0; i < examples.size(); i++) examples[i]->ft_offset = saved_offsets[i];
}